

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O1

void forkfd_initialize(void)

{
  long in_FS_OFFSET;
  sigaction action;
  sigaction local_148;
  _union_1457 local_b0;
  sigset_t local_a8;
  undefined4 local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_148,0xaa,0x98);
  memset(&local_148,0,0x98);
  sigemptyset(&local_148.sa_mask);
  local_148.sa_flags = 5;
  local_148.__sigaction_handler.sa_handler = sigchld_handler;
  sigaction(0x11,&local_148,(sigaction *)&old_sigaction);
  memset(&local_b0,0xaa,0x98);
  memset(&local_b0,0,0x98);
  sigemptyset(&local_a8);
  local_b0 = (_union_1457)0x1;
  local_28 = 0;
  sigaction(0xd,(sigaction *)&local_b0,(sigaction *)0x0);
  forkfd_status = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void forkfd_initialize()
{
#if defined(HAVE_BROKEN_WAITID)
    pid_t pid = fork();
    if (pid == 0) {
        _exit(0);
    } else if (pid > 0) {
        siginfo_t info;
        waitid(P_ALL, 0, &info, WNOWAIT | WEXITED);
        waitid_works = (info.si_pid != 0);
        info.si_pid = 0;

        // now really reap the child
        waitid(P_PID, pid, &info, WEXITED);
        waitid_works = waitid_works && (info.si_pid != 0);
    }
#endif

    /* install our signal handler */
    struct sigaction action;
    memset(&action, 0, sizeof action);
    sigemptyset(&action.sa_mask);
    action.sa_flags = SA_NOCLDSTOP | SA_SIGINFO;
    action.sa_sigaction = sigchld_handler;

    /* ### RACE CONDITION
     * The sigaction function does a memcpy from an internal buffer
     * to old_sigaction, which we use in the SIGCHLD handler. If a
     * SIGCHLD is delivered before or during that memcpy, the handler will
     * see an inconsistent state.
     *
     * There is no solution. pthread_sigmask doesn't work here because the
     * signal could be delivered to another thread.
     */
    sigaction(SIGCHLD, &action, &old_sigaction);

#ifndef O_NOSIGPIPE
    /* disable SIGPIPE too */
    ignore_sigpipe();
#endif

#ifdef __GNUC__
    (void) cleanup; /* suppress unused static function warning */
#else
    atexit(cleanup);
#endif

    ffd_atomic_store(&forkfd_status, 1, FFD_ATOMIC_RELAXED);
}